

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  HSQUIRRELVM v_00;
  SQInteger retval;
  HSQUIRRELVM v;
  SQInteger *in_stack_00000030;
  char **in_stack_00000038;
  int in_stack_00000044;
  HSQUIRRELVM in_stack_00000048;
  HSQUIRRELVM in_stack_00000420;
  HSQUIRRELVM v_01;
  SQInteger in_stack_ffffffffffffffe8;
  
  v_01 = (HSQUIRRELVM)0x0;
  v_00 = sq_open(in_stack_ffffffffffffffe8);
  sq_setprintfunc(v_00,printfunc,errorfunc);
  sq_pushroottable((HSQUIRRELVM)0x10701f);
  sqstd_register_bloblib((HSQUIRRELVM)0x107029);
  sqstd_register_iolib(v_01);
  sqstd_register_systemlib(v_01);
  sqstd_register_mathlib(v_01);
  sqstd_register_stringlib(v_01);
  sqstd_seterrorhandlers((HSQUIRRELVM)0x10705b);
  iVar1 = getargs(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
  if (iVar1 == 0) {
    Interactive(in_stack_00000420);
  }
  sq_close(v_01);
  return (int)v_01;
}

Assistant:

int main(int argc, char* argv[])
{
    HSQUIRRELVM v;
    SQInteger retval = 0;
#if defined(_MSC_VER) && defined(_DEBUG)
    _CrtSetAllocHook(MemAllocHook);
#endif

    v=sq_open(1024);
    sq_setprintfunc(v,printfunc,errorfunc);

    sq_pushroottable(v);

    sqstd_register_bloblib(v);
    sqstd_register_iolib(v);
    sqstd_register_systemlib(v);
    sqstd_register_mathlib(v);
    sqstd_register_stringlib(v);

    //aux library
    //sets error handlers
    sqstd_seterrorhandlers(v);

    //gets arguments
    switch(getargs(v,argc,argv,&retval))
    {
    case _INTERACTIVE:
        Interactive(v);
        break;
    case _DONE:
    case _ERROR:
    default:
        break;
    }

    sq_close(v);

#if defined(_MSC_VER) && defined(_DEBUG)
    _getch();
    _CrtMemDumpAllObjectsSince( NULL );
#endif
    return retval;
}